

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarScrollToTab(ImGuiTabBar *tab_bar,ImGuiTabItem *tab)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float local_40;
  float local_38;
  float tab_x2;
  float tab_x1;
  int order;
  float margin;
  ImGuiContext *g;
  ImGuiTabItem *tab_local;
  ImGuiTabBar *tab_bar_local;
  
  local_40 = GImGui->FontSize * 1.0;
  iVar1 = ImGuiTabBar::GetTabOrder(tab_bar,tab);
  if (iVar1 < 1) {
    local_38 = 0.0;
  }
  else {
    local_38 = -local_40;
  }
  local_38 = tab->Offset + local_38;
  if ((tab_bar->Tabs).Size <= iVar1 + 1) {
    local_40 = 1.0;
  }
  local_40 = tab->Offset + tab->Width + local_40;
  tab_bar->ScrollingTargetDistToVisibility = 0.0;
  if ((local_38 < tab_bar->ScrollingTarget) ||
     (fVar2 = ImRect::GetWidth(&tab_bar->BarRect), fVar2 <= local_40 - local_38)) {
    fVar2 = ImMax<float>(tab_bar->ScrollingAnim - local_40,0.0);
    tab_bar->ScrollingTargetDistToVisibility = fVar2;
    tab_bar->ScrollingTarget = local_38;
  }
  else {
    fVar2 = tab_bar->ScrollingTarget;
    fVar3 = ImRect::GetWidth(&tab_bar->BarRect);
    if (fVar2 < local_40 - fVar3) {
      fVar2 = ImRect::GetWidth(&tab_bar->BarRect);
      fVar2 = ImMax<float>((local_38 - fVar2) - tab_bar->ScrollingAnim,0.0);
      tab_bar->ScrollingTargetDistToVisibility = fVar2;
      fVar2 = ImRect::GetWidth(&tab_bar->BarRect);
      tab_bar->ScrollingTarget = local_40 - fVar2;
    }
  }
  return;
}

Assistant:

static void ImGui::TabBarScrollToTab(ImGuiTabBar* tab_bar, ImGuiTabItem* tab)
{
    ImGuiContext& g = *GImGui;
    float margin = g.FontSize * 1.0f; // When to scroll to make Tab N+1 visible always make a bit of N visible to suggest more scrolling area (since we don't have a scrollbar)
    int order = tab_bar->GetTabOrder(tab);
    float tab_x1 = tab->Offset + (order > 0 ? -margin : 0.0f);
    float tab_x2 = tab->Offset + tab->Width + (order + 1 < tab_bar->Tabs.Size ? margin : 1.0f);
    tab_bar->ScrollingTargetDistToVisibility = 0.0f;
    if (tab_bar->ScrollingTarget > tab_x1 || (tab_x2 - tab_x1 >= tab_bar->BarRect.GetWidth()))
    {
        tab_bar->ScrollingTargetDistToVisibility = ImMax(tab_bar->ScrollingAnim - tab_x2, 0.0f);
        tab_bar->ScrollingTarget = tab_x1;
    }
    else if (tab_bar->ScrollingTarget < tab_x2 - tab_bar->BarRect.GetWidth())
    {
        tab_bar->ScrollingTargetDistToVisibility = ImMax((tab_x1 - tab_bar->BarRect.GetWidth()) - tab_bar->ScrollingAnim, 0.0f);
        tab_bar->ScrollingTarget = tab_x2 - tab_bar->BarRect.GetWidth();
    }
}